

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_montgomery_double(void)

{
  MontgomeryCurve *mc;
  MontgomeryPoint *pMVar1;
  MontgomeryPoint *r;
  MontgomeryPoint *A;
  size_t i;
  MontgomeryPoint *a;
  MontgomeryCurve *wc;
  
  mc = mcurve();
  i = 0;
  for (A = (MontgomeryPoint *)0x0; pMVar1 = (MontgomeryPoint *)(*looplimit)(7), A < pMVar1;
      A = (MontgomeryPoint *)((long)&A->X + 1)) {
    pMVar1 = mpoint(mc,(size_t)A);
    if (i != 0) {
      ecc_montgomery_point_copy_into((MontgomeryPoint *)i,pMVar1);
      ecc_montgomery_point_free(pMVar1);
      pMVar1 = (MontgomeryPoint *)i;
    }
    i = (size_t)pMVar1;
    log_start();
    pMVar1 = ecc_montgomery_double((MontgomeryPoint *)i);
    log_end();
    ecc_montgomery_point_free(pMVar1);
  }
  ecc_montgomery_point_free((MontgomeryPoint *)i);
  ecc_montgomery_curve_free(mc);
  return;
}

Assistant:

static void test_ecc_montgomery_double(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }

        log_start();
        MontgomeryPoint *r = ecc_montgomery_double(a);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
}